

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O2

bool __thiscall
ZAP::ArchiveBuilder::buildFile(ArchiveBuilder *this,string *filename,Compression compression)

{
  char cVar1;
  bool bVar2;
  ofstream stream;
  
  std::ofstream::ofstream(&stream,(string *)filename,_S_trunc|_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    bVar2 = false;
  }
  else {
    bVar2 = build(this,(ostream *)&stream,compression);
  }
  std::ofstream::~ofstream(&stream);
  return bVar2;
}

Assistant:

bool ArchiveBuilder::buildFile(const std::string &filename, Compression compression)
	{
		std::ofstream stream(filename, std::ios::out | std::ios::trunc | std::ios::binary);
		if (!stream.is_open())
		{
			return false;
		}
		return build(stream, compression);
	}